

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_scalar.c
# Opt level: O1

rt_function_error_t exec_add_scalar_fixed8(rt_function_t *f)

{
  rt_variable_t *prVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  short sVar7;
  int iVar8;
  ulong uVar9;
  undefined1 uVar10;
  int iVar11;
  rt_list_t shape;
  
  calc_scalar_fixed8(f,*(float *)((long)f->local_context + 8),calc_add_fixed8);
  prVar1 = *f->outputs;
  pvVar2 = prVar1->data;
  shape._4_4_ = 0;
  shape.size = (prVar1->shape).size;
  shape.data = (prVar1->shape).data;
  uVar3 = calc_shape_size(shape);
  uVar4 = (uint)((byte)(*f->inputs)->field_0x10 >> 4);
  uVar6 = (uint)((byte)(*f->outputs)->field_0x10 >> 4);
  iVar5 = uVar4 - uVar6;
  if (iVar5 == 0 || uVar4 < uVar6) {
    if ((iVar5 < 0) && (uVar3 != 0)) {
      uVar9 = 0;
      do {
        iVar8 = (int)*(char *)((long)pvVar2 + uVar9) << (-(byte)iVar5 & 0x1f);
        sVar7 = (short)iVar8;
        iVar11 = 0x80;
        if (-0x80 < sVar7) {
          iVar11 = iVar8;
        }
        uVar10 = (undefined1)iVar11;
        if (0x7e < sVar7) {
          uVar10 = 0x7f;
        }
        *(undefined1 *)((long)pvVar2 + uVar9) = uVar10;
        uVar9 = uVar9 + 1;
      } while (uVar3 != uVar9);
    }
  }
  else if (uVar3 != 0) {
    uVar9 = 0;
    do {
      *(char *)((long)pvVar2 + uVar9) =
           (char)((int)*(char *)((long)pvVar2 + uVar9) /
                 ((0x1000000 << ((byte)iVar5 & 0x1f)) >> 0x18));
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_add_scalar_fixed8(rt_function_t *f) {
  add_scalar_local_context_t *context =
      (add_scalar_local_context_t *)(f->local_context);
  calc_scalar_fixed8(f, context->val, calc_add_fixed8);
  rescale_fixed8(f->outputs[0]->data, calc_shape_size(f->outputs[0]->shape),
                 f->inputs[0]->fp_pos, f->outputs[0]->fp_pos);
  return RT_FUNCTION_ERROR_NOERROR;
}